

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

bool __thiscall deqp::gles3::Functional::TextureSizeCase::initShader(TextureSizeCase *this)

{
  bool bVar1;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  TestContext *this_01;
  TestLog *log;
  ProgramSources local_138;
  undefined1 local_58 [8];
  string fragSrc;
  string vertSrc;
  TextureSizeCase *this_local;
  
  genVertexShader_abi_cxx11_((string *)((long)&fragSrc.field_2 + 8),this);
  genFragmentShader_abi_cxx11_((string *)local_58,this);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::makeVtxFragSources(&local_138,(string *)((long)&fragSrc.field_2 + 8),(string *)local_58);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_138);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_138);
  this_01 = gles3::Context::getTestContext((this->super_TestCase).m_context);
  log = tcu::TestContext::getLog(this_01);
  glu::operator<<(log,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed");
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(fragSrc.field_2._M_local_buf + 8));
  return bVar1;
}

Assistant:

bool TextureSizeCase::initShader (void)
{
	const std::string		vertSrc = genVertexShader();
	const std::string		fragSrc = genFragmentShader();

	DE_ASSERT(m_program == DE_NULL);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertSrc, fragSrc));
	m_context.getTestContext().getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader failed");
		return false;
	}

	return true;
}